

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall
CVmObjDict::del_word
          (CVmObjDict *this,vm_obj_id_t self,char *str,size_t len,vm_obj_id_t obj,
          vm_prop_id_t voc_prop)

{
  char *pcVar1;
  int iVar2;
  dict_undo_rec *rec;
  CVmObjDict *this_00;
  
  this_00 = this;
  iVar2 = del_hash_entry(this,str,len,obj,voc_prop);
  if ((iVar2 != 0) && (G_undo_X != (CVmUndo *)0x0)) {
    rec = alloc_undo_rec(this_00,DICT_UNDO_DEL,str,len);
    rec->obj = obj;
    rec->prop = voc_prop;
    add_undo_rec(this_00,self,rec);
  }
  pcVar1 = (this->super_CVmObject).ext_;
  pcVar1[0x18] = '\x01';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  return;
}

Assistant:

void CVmObjDict::del_word(VMG_ vm_obj_id_t self,
                          const char *str, size_t len,
                          vm_obj_id_t obj, vm_prop_id_t voc_prop)
{
    /* delete this entry */
    int deleted = del_hash_entry(vmg_ str, len, obj, voc_prop);

    /* 
     *   if there's a global undo object, and we actually deleted an
     *   entry, add undo for the change 
     */
    if (deleted && G_undo != 0)
    {
        dict_undo_rec *undo_rec;

        /* create the undo record */
        undo_rec = alloc_undo_rec(DICT_UNDO_DEL, str, len);
        undo_rec->obj = obj;
        undo_rec->prop = voc_prop;

        /* add the undo record */
        add_undo_rec(vmg_ self, undo_rec);
    }

    /* mark the object as modified since load */
    get_ext()->modified_ = TRUE;
}